

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

uint8 * __thiscall
caffe::Datum::InternalSerializeWithCachedSizesToArray(Datum *this,bool deterministic,uint8 *target)

{
  uint uVar1;
  uint8 *puVar2;
  UnknownFieldSet *unknown_fields;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 2) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArray(1,this->channels_,target)
    ;
  }
  if ((uVar1 & 4) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArray(2,this->height_,target);
  }
  if ((uVar1 & 8) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArray(3,this->width_,target);
  }
  if ((uVar1 & 1) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteBytesToArray
                       (4,(this->data_).ptr_,target);
  }
  if ((uVar1 & 0x10) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArray(5,this->label_,target);
  }
  puVar2 = google::protobuf::internal::WireFormatLite::WriteFloatToArray
                     (6,&this->float_data_,target);
  if ((uVar1 & 0x20) != 0) {
    puVar2 = google::protobuf::internal::WireFormatLite::WriteBoolToArray(7,this->encoded_,puVar2);
  }
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    return puVar2;
  }
  unknown_fields = Datum::unknown_fields(this);
  puVar2 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                     (unknown_fields,puVar2);
  return puVar2;
}

Assistant:

::google::protobuf::uint8* Datum::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.Datum)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional int32 channels = 1;
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(1, this->channels(), target);
  }

  // optional int32 height = 2;
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(2, this->height(), target);
  }

  // optional int32 width = 3;
  if (cached_has_bits & 0x00000008u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(3, this->width(), target);
  }

  // optional bytes data = 4;
  if (cached_has_bits & 0x00000001u) {
    target =
      ::google::protobuf::internal::WireFormatLite::WriteBytesToArray(
        4, this->data(), target);
  }

  // optional int32 label = 5;
  if (cached_has_bits & 0x00000010u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(5, this->label(), target);
  }

  // repeated float float_data = 6;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteFloatToArray(6, this->float_data_, target);

  // optional bool encoded = 7 [default = false];
  if (cached_has_bits & 0x00000020u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(7, this->encoded(), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.Datum)
  return target;
}